

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deserializer.hpp
# Opt level: O2

vector<bool,_true> * __thiscall
duckdb::Deserializer::ReadPropertyWithDefault<duckdb::vector<bool,true>>
          (vector<bool,_true> *__return_storage_ptr__,Deserializer *this,field_id_t field_id,
          char *tag)

{
  int iVar1;
  undefined6 in_register_00000012;
  _Bvector_base<std::allocator<bool>_> local_38;
  
  iVar1 = (*this->_vptr_Deserializer[4])
                    (this,CONCAT62(in_register_00000012,field_id) & 0xffffffff,tag);
  if ((char)iVar1 == '\0') {
    (*this->_vptr_Deserializer[5])(this,0);
    local_38._M_impl.super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
    local_38._M_impl.super__Bvector_impl_data._M_finish.super__Bit_iterator_base._12_4_ = 0;
    (__return_storage_ptr__->super_vector<bool,_std::allocator<bool>_>).
    super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_end_of_storage =
         (_Bit_pointer)0x0;
    local_38._M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
    local_38._M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._12_4_ = 0;
    local_38._M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p =
         (_Bit_type *)0x0;
    (__return_storage_ptr__->super_vector<bool,_std::allocator<bool>_>).
    super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    *(undefined8 *)
     &(__return_storage_ptr__->super_vector<bool,_std::allocator<bool>_>).
      super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
      super__Bit_iterator_base._M_offset = 0;
    local_38._M_impl.super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p =
         (_Bit_type *)0x0;
    (__return_storage_ptr__->super_vector<bool,_std::allocator<bool>_>).
    super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    *(undefined8 *)
     &(__return_storage_ptr__->super_vector<bool,_std::allocator<bool>_>).
      super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_offset = 0;
    local_38._M_impl.super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
    ::std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base(&local_38);
  }
  else {
    Read<duckdb::vector<bool,true>>(__return_storage_ptr__,this);
    (*this->_vptr_Deserializer[5])(this,1);
  }
  return __return_storage_ptr__;
}

Assistant:

inline T ReadPropertyWithDefault(const field_id_t field_id, const char *tag) {
		if (!OnOptionalPropertyBegin(field_id, tag)) {
			OnOptionalPropertyEnd(false);
			return std::forward<T>(SerializationDefaultValue::GetDefault<T>());
		}
		auto ret = Read<T>();
		OnOptionalPropertyEnd(true);
		return ret;
	}